

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

double __thiscall NEST::LArNEST::GetNRElectronYields(LArNEST *this,double energy,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (this->fNR).gamma;
  dVar2 = pow(efield,(this->fNR).delta);
  dVar3 = (this->fNR).epsilon + energy;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = pow(energy / (this->fNR).zeta,(this->fNR).eta);
  return (1.0 - 1.0 / (dVar4 + 1.0)) * (1.0 / (dVar2 * dVar1)) * (1.0 / dVar3);
}

Assistant:

double LArNEST::GetNRElectronYields(double energy, double efield) {
  return (1.0 / (fNR.gamma * pow(efield, fNR.delta))) *
         (1.0 / sqrt(energy + fNR.epsilon)) *
         (1.0 - 1.0 / (1.0 + pow(energy / fNR.zeta, fNR.eta)));
}